

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

bool __thiscall
re2::RE2::Match(RE2 *this,StringPiece *text,int startpos,int endpos,Anchor re_anchor,
               StringPiece *submatch,int nsubmatch)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  MatchKind MVar4;
  ostream *poVar5;
  ulong uVar6;
  char *pcVar7;
  char *b;
  void *__s1;
  iterator pcVar8;
  long lVar9;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double __x_06;
  double __x_07;
  double __x_08;
  double __x_09;
  double __x_10;
  double __x_11;
  bool local_2209;
  StringPiece local_2168;
  Anchor local_2154;
  undefined1 auStack_2150 [4];
  int i;
  int local_2148;
  LogMessage local_2140;
  re2 local_1fc0 [32];
  StringPiece local_1fa0;
  re2 local_1f90 [32];
  LogMessage local_1f70;
  LogMessage local_1df0;
  re2 local_1c70 [32];
  StringPiece local_1c50;
  re2 local_1c40 [32];
  LogMessage local_1c20;
  LogMessage local_1aa0;
  re2 local_1920 [32];
  StringPiece local_1900;
  re2 local_18f0 [32];
  LogMessage local_18d0;
  undefined1 local_1750 [8];
  StringPiece subtext1;
  StringPiece local_1720;
  re2 local_1710 [32];
  LogMessage local_16f0;
  re2 local_1570 [32];
  StringPiece local_1550;
  re2 local_1540 [32];
  LogMessage local_1520;
  re2 local_13a0 [32];
  StringPiece local_1380;
  re2 local_1370 [32];
  LogMessage local_1350;
  re2 local_11d0 [32];
  StringPiece local_11b0;
  re2 local_11a0 [32];
  LogMessage local_1180;
  re2 local_1000 [32];
  StringPiece local_fe0;
  re2 local_fd0 [32];
  LogMessage local_fb0;
  LogMessage local_e30;
  re2 local_cb0 [32];
  StringPiece local_c90;
  re2 local_c80 [32];
  LogMessage local_c60;
  re2 local_ae0 [32];
  StringPiece local_ac0;
  re2 local_ab0 [32];
  LogMessage local_a90;
  Prog *local_910;
  Prog *prog;
  StringPiece local_8e8;
  re2 local_8d8 [32];
  LogMessage local_8b8;
  re2 local_738 [32];
  StringPiece local_718;
  re2 local_708 [32];
  LogMessage local_6e8;
  re2 local_568 [32];
  StringPiece local_548;
  re2 local_538 [32];
  LogMessage local_518;
  bool local_395;
  int local_394;
  bool dfa_failed;
  int bit_state_text_max;
  undefined4 uStack_388;
  bool can_bit_state;
  int MaxBitStateVector;
  int MaxBitStateProg;
  bool can_one_pass;
  Anchor AStack_37c;
  bool skipped_test;
  MatchKind kind;
  Anchor anchor;
  int prefixlen;
  int ncap;
  StringPiece *matchp;
  StringPiece match;
  StringPiece subtext;
  LogMessage local_1b8;
  StringPiece *local_38;
  StringPiece *submatch_local;
  int local_28;
  Anchor re_anchor_local;
  int endpos_local;
  int startpos_local;
  StringPiece *text_local;
  RE2 *this_local;
  
  local_38 = submatch;
  submatch_local._4_4_ = re_anchor;
  local_28 = endpos;
  re_anchor_local = startpos;
  _endpos_local = text;
  text_local = (StringPiece *)this;
  bVar1 = ok(this);
  iVar3 = local_28;
  if ((bVar1) && (this->suffix_regexp_ != (Regexp *)0x0)) {
    if ((((int)re_anchor_local < 0) || (local_28 < (int)re_anchor_local)) ||
       (iVar2 = StringPiece::size(_endpos_local), iVar2 < iVar3)) {
      bVar1 = Options::log_errors(&this->options_);
      if (bVar1) {
        LogMessage::LogMessage
                  ((LogMessage *)&subtext.length_,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",
                   0x228,2);
        poVar5 = LogMessage::stream((LogMessage *)&subtext.length_);
        poVar5 = std::operator<<(poVar5,"RE2: invalid startpos, endpos pair. [");
        poVar5 = std::operator<<(poVar5,"startpos: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,re_anchor_local);
        poVar5 = std::operator<<(poVar5,", ");
        poVar5 = std::operator<<(poVar5,"endpos: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_28);
        poVar5 = std::operator<<(poVar5,", ");
        poVar5 = std::operator<<(poVar5,"text size: ");
        iVar3 = StringPiece::size(_endpos_local);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
        std::operator<<(poVar5,"]");
        LogMessage::~LogMessage((LogMessage *)&subtext.length_);
      }
      this_local._7_1_ = false;
    }
    else {
      match._8_8_ = _endpos_local->ptr_;
      subtext.ptr_ = *(char **)&_endpos_local->length_;
      StringPiece::remove_prefix((StringPiece *)&match.length_,re_anchor_local);
      iVar3 = StringPiece::size(_endpos_local);
      StringPiece::remove_suffix((StringPiece *)&match.length_,iVar3 - local_28);
      StringPiece::StringPiece((StringPiece *)&matchp);
      _prefixlen = (StringPiece *)&matchp;
      if (nsubmatch == 0) {
        _prefixlen = (StringPiece *)0x0;
      }
      iVar3 = NumberOfCapturingGroups(this);
      anchor = iVar3 + kAnchored;
      if (nsubmatch < (int)anchor) {
        anchor = nsubmatch;
      }
      bVar1 = Prog::anchor_start(this->prog_);
      if ((bVar1) && (re_anchor_local != UNANCHORED)) {
        this_local._7_1_ = false;
      }
      else {
        bVar1 = Prog::anchor_start(this->prog_);
        if ((bVar1) && (bVar1 = Prog::anchor_end(this->prog_), bVar1)) {
          submatch_local._4_4_ = ANCHOR_BOTH;
        }
        else {
          bVar1 = Prog::anchor_start(this->prog_);
          if ((bVar1) && (submatch_local._4_4_ != ANCHOR_BOTH)) {
            submatch_local._4_4_ = ANCHOR_START;
          }
        }
        kind = kFirstMatch;
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          if (re_anchor_local != UNANCHORED) {
            return false;
          }
          MVar4 = std::__cxx11::string::size();
          kind = MVar4;
          iVar3 = StringPiece::size((StringPiece *)&match.length_);
          if (iVar3 < (int)MVar4) {
            return false;
          }
          if ((this->prefix_foldcase_ & 1U) == 0) {
            __s1 = (void *)std::__cxx11::string::operator[]((ulong)&this->prefix_);
            pcVar7 = StringPiece::data((StringPiece *)&match.length_);
            iVar3 = memcmp(__s1,pcVar7,(long)(int)kind);
            if (iVar3 != 0) {
              return false;
            }
          }
          else {
            pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)&this->prefix_);
            b = StringPiece::data((StringPiece *)&match.length_);
            iVar3 = ascii_strcasecmp(pcVar7,b,kind);
            if (iVar3 != 0) {
              return false;
            }
          }
          StringPiece::remove_prefix((StringPiece *)&match.length_,kind);
          if (submatch_local._4_4_ != ANCHOR_BOTH) {
            submatch_local._4_4_ = ANCHOR_START;
          }
        }
        AStack_37c = kUnanchored;
        MaxBitStateProg = 0;
        bVar1 = Options::longest_match(&this->options_);
        if (bVar1) {
          MaxBitStateProg = 1;
        }
        MaxBitStateVector._3_1_ = 0;
        local_2209 = (this->is_one_pass_ & 1U) != 0 && (int)anchor < 6;
        MaxBitStateVector._2_1_ = local_2209;
        uStack_388 = 500;
        bit_state_text_max = 0x40000;
        iVar3 = Prog::size(this->prog_);
        dfa_failed = iVar3 < 0x1f5;
        iVar3 = Prog::size(this->prog_);
        local_394 = (int)(0x40000 / (long)iVar3);
        local_395 = false;
        if ((submatch_local._4_4_ == UNANCHORED) || (1 < submatch_local._4_4_ - ANCHOR_START)) {
          bVar1 = Prog::SearchDFA(this->prog_,(StringPiece *)&match.length_,_endpos_local,AStack_37c
                                  ,MaxBitStateProg,_prefixlen,&local_395,
                                  (vector<int,_std::allocator<int>_> *)0x0);
          if (bVar1) {
            if ((FLAGS_trace_re2 & 1) != 0) {
              LogMessage::LogMessage
                        (&local_8b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                         ,0x288,0);
              poVar5 = LogMessage::stream(&local_8b8);
              poVar5 = std::operator<<(poVar5,"Match ");
              StringPiece::StringPiece(&local_8e8,&this->pattern_);
              trunc_abi_cxx11_(local_8d8,__x_01);
              poVar5 = std::operator<<(poVar5,(string *)local_8d8);
              poVar5 = std::operator<<(poVar5," [");
              CEscape_abi_cxx11_((re2 *)&prog,(StringPiece *)&match.length_);
              poVar5 = std::operator<<(poVar5,(string *)&prog);
              poVar5 = std::operator<<(poVar5,"]");
              std::operator<<(poVar5," used DFA - match");
              std::__cxx11::string::~string((string *)&prog);
              std::__cxx11::string::~string((string *)local_8d8);
              LogMessage::~LogMessage(&local_8b8);
            }
            if (_prefixlen == (StringPiece *)0x0) {
              return true;
            }
            local_910 = ReverseProg(this);
            if (local_910 == (Prog *)0x0) {
              return false;
            }
            bVar1 = Prog::SearchDFA(local_910,(StringPiece *)&matchp,_endpos_local,kAnchored,
                                    kLongestMatch,(StringPiece *)&matchp,&local_395,
                                    (vector<int,_std::allocator<int>_> *)0x0);
            if (bVar1) {
              if ((FLAGS_trace_re2 & 1) != 0) {
                LogMessage::LogMessage
                          (&local_fb0,
                           "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                           ,0x2a7,0);
                poVar5 = LogMessage::stream(&local_fb0);
                poVar5 = std::operator<<(poVar5,"Match ");
                StringPiece::StringPiece(&local_fe0,&this->pattern_);
                trunc_abi_cxx11_(local_fd0,__x_04);
                poVar5 = std::operator<<(poVar5,(string *)local_fd0);
                poVar5 = std::operator<<(poVar5," [");
                CEscape_abi_cxx11_(local_1000,(StringPiece *)&match.length_);
                poVar5 = std::operator<<(poVar5,(string *)local_1000);
                poVar5 = std::operator<<(poVar5,"]");
                std::operator<<(poVar5," used reverse DFA.");
                std::__cxx11::string::~string((string *)local_1000);
                std::__cxx11::string::~string((string *)local_fd0);
                LogMessage::~LogMessage(&local_fb0);
              }
            }
            else {
              if ((local_395 & 1U) == 0) {
                if ((FLAGS_trace_re2 & 1) != 0) {
                  LogMessage::LogMessage
                            (&local_c60,
                             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                             ,0x29f,0);
                  poVar5 = LogMessage::stream(&local_c60);
                  poVar5 = std::operator<<(poVar5,"Match ");
                  StringPiece::StringPiece(&local_c90,&this->pattern_);
                  trunc_abi_cxx11_(local_c80,__x_03);
                  poVar5 = std::operator<<(poVar5,(string *)local_c80);
                  poVar5 = std::operator<<(poVar5," [");
                  CEscape_abi_cxx11_(local_cb0,(StringPiece *)&match.length_);
                  poVar5 = std::operator<<(poVar5,(string *)local_cb0);
                  poVar5 = std::operator<<(poVar5,"]");
                  std::operator<<(poVar5," DFA inconsistency.");
                  std::__cxx11::string::~string((string *)local_cb0);
                  std::__cxx11::string::~string((string *)local_c80);
                  LogMessage::~LogMessage(&local_c60);
                }
                bVar1 = Options::log_errors(&this->options_);
                if (bVar1) {
                  LogMessage::LogMessage
                            (&local_e30,
                             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                             ,0x2a3,2);
                  poVar5 = LogMessage::stream(&local_e30);
                  std::operator<<(poVar5,"DFA inconsistency");
                  LogMessage::~LogMessage(&local_e30);
                }
                return false;
              }
              MaxBitStateVector._3_1_ = 1;
              if ((FLAGS_trace_re2 & 1) != 0) {
                LogMessage::LogMessage
                          (&local_a90,
                           "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                           ,0x299,0);
                poVar5 = LogMessage::stream(&local_a90);
                poVar5 = std::operator<<(poVar5,"Match ");
                StringPiece::StringPiece(&local_ac0,&this->pattern_);
                trunc_abi_cxx11_(local_ab0,__x_02);
                poVar5 = std::operator<<(poVar5,(string *)local_ab0);
                poVar5 = std::operator<<(poVar5," [");
                CEscape_abi_cxx11_(local_ae0,(StringPiece *)&match.length_);
                poVar5 = std::operator<<(poVar5,(string *)local_ae0);
                poVar5 = std::operator<<(poVar5,"]");
                std::operator<<(poVar5," reverse DFA failed.");
                std::__cxx11::string::~string((string *)local_ae0);
                std::__cxx11::string::~string((string *)local_ab0);
                LogMessage::~LogMessage(&local_a90);
              }
            }
          }
          else {
            if ((local_395 & 1U) == 0) {
              if ((FLAGS_trace_re2 & 1) != 0) {
                LogMessage::LogMessage
                          (&local_6e8,
                           "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                           ,0x282,0);
                poVar5 = LogMessage::stream(&local_6e8);
                poVar5 = std::operator<<(poVar5,"Match ");
                StringPiece::StringPiece(&local_718,&this->pattern_);
                trunc_abi_cxx11_(local_708,__x_00);
                poVar5 = std::operator<<(poVar5,(string *)local_708);
                poVar5 = std::operator<<(poVar5," [");
                CEscape_abi_cxx11_(local_738,(StringPiece *)&match.length_);
                poVar5 = std::operator<<(poVar5,(string *)local_738);
                poVar5 = std::operator<<(poVar5,"]");
                std::operator<<(poVar5," used DFA - no match.");
                std::__cxx11::string::~string((string *)local_738);
                std::__cxx11::string::~string((string *)local_708);
                LogMessage::~LogMessage(&local_6e8);
              }
              return false;
            }
            MaxBitStateVector._3_1_ = 1;
            if ((FLAGS_trace_re2 & 1) != 0) {
              LogMessage::LogMessage
                        (&local_518,
                         "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                         ,0x27c,0);
              poVar5 = LogMessage::stream(&local_518);
              poVar5 = std::operator<<(poVar5,"Match ");
              StringPiece::StringPiece(&local_548,&this->pattern_);
              trunc_abi_cxx11_(local_538,__x);
              poVar5 = std::operator<<(poVar5,(string *)local_538);
              poVar5 = std::operator<<(poVar5," [");
              CEscape_abi_cxx11_(local_568,(StringPiece *)&match.length_);
              poVar5 = std::operator<<(poVar5,(string *)local_568);
              poVar5 = std::operator<<(poVar5,"]");
              std::operator<<(poVar5," DFA failed.");
              std::__cxx11::string::~string((string *)local_568);
              std::__cxx11::string::~string((string *)local_538);
              LogMessage::~LogMessage(&local_518);
            }
          }
        }
        else {
          if (submatch_local._4_4_ == ANCHOR_BOTH) {
            MaxBitStateProg = 2;
          }
          AStack_37c = kAnchored;
          if ((((MaxBitStateVector._2_1_ & 1) == 0) ||
              (iVar3 = StringPiece::size(_endpos_local), 0x1000 < iVar3)) ||
             (((int)anchor < 2 && (iVar3 = StringPiece::size(_endpos_local), 8 < iVar3)))) {
            if ((((dfa_failed & 1U) == 0) ||
                (iVar3 = StringPiece::size(_endpos_local), local_394 < iVar3)) || ((int)anchor < 2))
            {
              bVar1 = Prog::SearchDFA(this->prog_,(StringPiece *)&match.length_,_endpos_local,
                                      AStack_37c,MaxBitStateProg,(StringPiece *)&matchp,&local_395,
                                      (vector<int,_std::allocator<int>_> *)0x0);
              if (!bVar1) {
                if ((local_395 & 1U) == 0) {
                  if ((FLAGS_trace_re2 & 1) != 0) {
                    LogMessage::LogMessage
                              (&local_16f0,
                               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                               ,0x2d6,0);
                    poVar5 = LogMessage::stream(&local_16f0);
                    poVar5 = std::operator<<(poVar5,"Match ");
                    StringPiece::StringPiece(&local_1720,&this->pattern_);
                    trunc_abi_cxx11_(local_1710,__x_08);
                    poVar5 = std::operator<<(poVar5,(string *)local_1710);
                    poVar5 = std::operator<<(poVar5," [");
                    CEscape_abi_cxx11_((re2 *)&subtext1.length_,(StringPiece *)&match.length_);
                    poVar5 = std::operator<<(poVar5,(string *)&subtext1.length_);
                    poVar5 = std::operator<<(poVar5,"]");
                    std::operator<<(poVar5," used DFA - no match.");
                    std::__cxx11::string::~string((string *)&subtext1.length_);
                    std::__cxx11::string::~string((string *)local_1710);
                    LogMessage::~LogMessage(&local_16f0);
                  }
                  return false;
                }
                if ((FLAGS_trace_re2 & 1) != 0) {
                  LogMessage::LogMessage
                            (&local_1520,
                             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                             ,0x2cf,0);
                  poVar5 = LogMessage::stream(&local_1520);
                  poVar5 = std::operator<<(poVar5,"Match ");
                  StringPiece::StringPiece(&local_1550,&this->pattern_);
                  trunc_abi_cxx11_(local_1540,__x_07);
                  poVar5 = std::operator<<(poVar5,(string *)local_1540);
                  poVar5 = std::operator<<(poVar5," [");
                  CEscape_abi_cxx11_(local_1570,(StringPiece *)&match.length_);
                  poVar5 = std::operator<<(poVar5,(string *)local_1570);
                  poVar5 = std::operator<<(poVar5,"]");
                  std::operator<<(poVar5," DFA failed.");
                  std::__cxx11::string::~string((string *)local_1570);
                  std::__cxx11::string::~string((string *)local_1540);
                  LogMessage::~LogMessage(&local_1520);
                }
                MaxBitStateVector._3_1_ = 1;
              }
            }
            else {
              if ((FLAGS_trace_re2 & 1) != 0) {
                LogMessage::LogMessage
                          (&local_1350,
                           "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                           ,0x2c5,0);
                poVar5 = LogMessage::stream(&local_1350);
                poVar5 = std::operator<<(poVar5,"Match ");
                StringPiece::StringPiece(&local_1380,&this->pattern_);
                trunc_abi_cxx11_(local_1370,__x_06);
                poVar5 = std::operator<<(poVar5,(string *)local_1370);
                poVar5 = std::operator<<(poVar5," [");
                CEscape_abi_cxx11_(local_13a0,(StringPiece *)&match.length_);
                poVar5 = std::operator<<(poVar5,(string *)local_13a0);
                poVar5 = std::operator<<(poVar5,"]");
                std::operator<<(poVar5," skipping DFA for BitState.");
                std::__cxx11::string::~string((string *)local_13a0);
                std::__cxx11::string::~string((string *)local_1370);
                LogMessage::~LogMessage(&local_1350);
              }
              MaxBitStateVector._3_1_ = 1;
            }
          }
          else {
            if ((FLAGS_trace_re2 & 1) != 0) {
              LogMessage::LogMessage
                        (&local_1180,
                         "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                         ,0x2bd,0);
              poVar5 = LogMessage::stream(&local_1180);
              poVar5 = std::operator<<(poVar5,"Match ");
              StringPiece::StringPiece(&local_11b0,&this->pattern_);
              trunc_abi_cxx11_(local_11a0,__x_05);
              poVar5 = std::operator<<(poVar5,(string *)local_11a0);
              poVar5 = std::operator<<(poVar5," [");
              CEscape_abi_cxx11_(local_11d0,(StringPiece *)&match.length_);
              poVar5 = std::operator<<(poVar5,(string *)local_11d0);
              poVar5 = std::operator<<(poVar5,"]");
              std::operator<<(poVar5," skipping DFA for OnePass.");
              std::__cxx11::string::~string((string *)local_11d0);
              std::__cxx11::string::~string((string *)local_11a0);
              LogMessage::~LogMessage(&local_1180);
            }
            MaxBitStateVector._3_1_ = 1;
          }
        }
        if (((MaxBitStateVector._3_1_ & 1) == 0) && ((int)anchor < 2)) {
          if (anchor == kAnchored) {
            local_38->ptr_ = (char *)matchp;
            local_38->length_ = (int)match.ptr_;
          }
        }
        else {
          StringPiece::StringPiece((StringPiece *)local_1750);
          if ((MaxBitStateVector._3_1_ & 1) == 0) {
            local_1750 = (undefined1  [8])matchp;
            subtext1.ptr_._0_4_ = (int)match.ptr_;
            AStack_37c = kAnchored;
            MaxBitStateProg = 2;
          }
          else {
            local_1750 = (undefined1  [8])match._8_8_;
            subtext1.ptr_._0_4_ = (int)subtext.ptr_;
          }
          if (((MaxBitStateVector._2_1_ & 1) == 0) || (AStack_37c == kUnanchored)) {
            if (((dfa_failed & 1U) == 0) ||
               (iVar3 = StringPiece::size((StringPiece *)local_1750), local_394 < iVar3)) {
              if ((FLAGS_trace_re2 & 1) != 0) {
                LogMessage::LogMessage
                          (&local_1f70,
                           "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                           ,0x308,0);
                poVar5 = LogMessage::stream(&local_1f70);
                poVar5 = std::operator<<(poVar5,"Match ");
                StringPiece::StringPiece(&local_1fa0,&this->pattern_);
                trunc_abi_cxx11_(local_1f90,__x_11);
                poVar5 = std::operator<<(poVar5,(string *)local_1f90);
                poVar5 = std::operator<<(poVar5," [");
                CEscape_abi_cxx11_(local_1fc0,(StringPiece *)&match.length_);
                poVar5 = std::operator<<(poVar5,(string *)local_1fc0);
                poVar5 = std::operator<<(poVar5,"]");
                std::operator<<(poVar5," using NFA.");
                std::__cxx11::string::~string((string *)local_1fc0);
                std::__cxx11::string::~string((string *)local_1f90);
                LogMessage::~LogMessage(&local_1f70);
              }
              bVar1 = Prog::SearchNFA(this->prog_,(StringPiece *)local_1750,_endpos_local,AStack_37c
                                      ,MaxBitStateProg,local_38,anchor);
              if (!bVar1) {
                if (((MaxBitStateVector._3_1_ & 1) == 0) &&
                   (bVar1 = Options::log_errors(&this->options_), bVar1)) {
                  LogMessage::LogMessage
                            (&local_2140,
                             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                             ,0x30d,2);
                  poVar5 = LogMessage::stream(&local_2140);
                  std::operator<<(poVar5,"SearchNFA inconsistency");
                  LogMessage::~LogMessage(&local_2140);
                }
                return false;
              }
            }
            else {
              if ((FLAGS_trace_re2 & 1) != 0) {
                LogMessage::LogMessage
                          (&local_1c20,
                           "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                           ,0x2fd,0);
                poVar5 = LogMessage::stream(&local_1c20);
                poVar5 = std::operator<<(poVar5,"Match ");
                StringPiece::StringPiece(&local_1c50,&this->pattern_);
                trunc_abi_cxx11_(local_1c40,__x_10);
                poVar5 = std::operator<<(poVar5,(string *)local_1c40);
                poVar5 = std::operator<<(poVar5," [");
                CEscape_abi_cxx11_(local_1c70,(StringPiece *)&match.length_);
                poVar5 = std::operator<<(poVar5,(string *)local_1c70);
                poVar5 = std::operator<<(poVar5,"]");
                std::operator<<(poVar5," using BitState.");
                std::__cxx11::string::~string((string *)local_1c70);
                std::__cxx11::string::~string((string *)local_1c40);
                LogMessage::~LogMessage(&local_1c20);
              }
              bVar1 = Prog::SearchBitState
                                (this->prog_,(StringPiece *)local_1750,_endpos_local,AStack_37c,
                                 MaxBitStateProg,local_38,anchor);
              if (!bVar1) {
                if (((MaxBitStateVector._3_1_ & 1) == 0) &&
                   (bVar1 = Options::log_errors(&this->options_), bVar1)) {
                  LogMessage::LogMessage
                            (&local_1df0,
                             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                             ,0x303,2);
                  poVar5 = LogMessage::stream(&local_1df0);
                  std::operator<<(poVar5,"SearchBitState inconsistency");
                  LogMessage::~LogMessage(&local_1df0);
                }
                return false;
              }
            }
          }
          else {
            if ((FLAGS_trace_re2 & 1) != 0) {
              LogMessage::LogMessage
                        (&local_18d0,
                         "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                         ,0x2f3,0);
              poVar5 = LogMessage::stream(&local_18d0);
              poVar5 = std::operator<<(poVar5,"Match ");
              StringPiece::StringPiece(&local_1900,&this->pattern_);
              trunc_abi_cxx11_(local_18f0,__x_09);
              poVar5 = std::operator<<(poVar5,(string *)local_18f0);
              poVar5 = std::operator<<(poVar5," [");
              CEscape_abi_cxx11_(local_1920,(StringPiece *)&match.length_);
              poVar5 = std::operator<<(poVar5,(string *)local_1920);
              poVar5 = std::operator<<(poVar5,"]");
              std::operator<<(poVar5," using OnePass.");
              std::__cxx11::string::~string((string *)local_1920);
              std::__cxx11::string::~string((string *)local_18f0);
              LogMessage::~LogMessage(&local_18d0);
            }
            bVar1 = Prog::SearchOnePass(this->prog_,(StringPiece *)local_1750,_endpos_local,
                                        AStack_37c,MaxBitStateProg,local_38,anchor);
            if (!bVar1) {
              if (((MaxBitStateVector._3_1_ & 1) == 0) &&
                 (bVar1 = Options::log_errors(&this->options_), bVar1)) {
                LogMessage::LogMessage
                          (&local_1aa0,
                           "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                           ,0x2f8,2);
                poVar5 = LogMessage::stream(&local_1aa0);
                std::operator<<(poVar5,"SearchOnePass inconsistency");
                LogMessage::~LogMessage(&local_1aa0);
              }
              return false;
            }
          }
        }
        if ((0 < (int)kind) && (0 < nsubmatch)) {
          pcVar8 = StringPiece::begin(local_38);
          lVar9 = (long)(int)kind;
          iVar3 = StringPiece::size(local_38);
          StringPiece::StringPiece((StringPiece *)auStack_2150,pcVar8 + -lVar9,iVar3 + kind);
          local_38->ptr_ = _auStack_2150;
          local_38->length_ = local_2148;
        }
        for (local_2154 = anchor; (int)local_2154 < nsubmatch; local_2154 = local_2154 + kAnchored)
        {
          StringPiece::StringPiece(&local_2168,(char *)0x0);
          local_38[(int)local_2154].ptr_ = local_2168.ptr_;
          local_38[(int)local_2154].length_ = local_2168.length_;
        }
        this_local._7_1_ = true;
      }
    }
  }
  else {
    bVar1 = Options::log_errors(&this->options_);
    if (bVar1) {
      LogMessage::LogMessage
                (&local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x222
                 ,2);
      poVar5 = LogMessage::stream(&local_1b8);
      poVar5 = std::operator<<(poVar5,"Invalid RE2: ");
      std::operator<<(poVar5,(string *)this->error_);
      LogMessage::~LogMessage(&local_1b8);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RE2::Match(const StringPiece& text,
                int startpos,
                int endpos,
                Anchor re_anchor,
                StringPiece* submatch,
                int nsubmatch) const {
  if (!ok() || suffix_regexp_ == NULL) {
    if (options_.log_errors())
      LOG(ERROR) << "Invalid RE2: " << *error_;
    return false;
  }

  if (startpos < 0 || startpos > endpos || endpos > text.size()) {
    if (options_.log_errors())
      LOG(ERROR) << "RE2: invalid startpos, endpos pair. ["
                 << "startpos: " << startpos << ", "
                 << "endpos: " << endpos << ", "
                 << "text size: " << text.size() << "]";
    return false;
  }

  StringPiece subtext = text;
  subtext.remove_prefix(startpos);
  subtext.remove_suffix(text.size() - endpos);

  // Use DFAs to find exact location of match, filter out non-matches.

  // Don't ask for the location if we won't use it.
  // SearchDFA can do extra optimizations in that case.
  StringPiece match;
  StringPiece* matchp = &match;
  if (nsubmatch == 0)
    matchp = NULL;

  int ncap = 1 + NumberOfCapturingGroups();
  if (ncap > nsubmatch)
    ncap = nsubmatch;

  // If the regexp is anchored explicitly, must not be in middle of text.
  if (prog_->anchor_start() && startpos != 0)
    return false;

  // If the regexp is anchored explicitly, update re_anchor
  // so that we can potentially fall into a faster case below.
  if (prog_->anchor_start() && prog_->anchor_end())
    re_anchor = ANCHOR_BOTH;
  else if (prog_->anchor_start() && re_anchor != ANCHOR_BOTH)
    re_anchor = ANCHOR_START;

  // Check for the required prefix, if any.
  int prefixlen = 0;
  if (!prefix_.empty()) {
    if (startpos != 0)
      return false;
    prefixlen = static_cast<int>(prefix_.size());
    if (prefixlen > subtext.size())
      return false;
    if (prefix_foldcase_) {
      if (ascii_strcasecmp(&prefix_[0], subtext.data(), prefixlen) != 0)
        return false;
    } else {
      if (memcmp(&prefix_[0], subtext.data(), prefixlen) != 0)
        return false;
    }
    subtext.remove_prefix(prefixlen);
    // If there is a required prefix, the anchor must be at least ANCHOR_START.
    if (re_anchor != ANCHOR_BOTH)
      re_anchor = ANCHOR_START;
  }

  Prog::Anchor anchor = Prog::kUnanchored;
  Prog::MatchKind kind = Prog::kFirstMatch;
  if (options_.longest_match())
    kind = Prog::kLongestMatch;
  bool skipped_test = false;

  bool can_one_pass = (is_one_pass_ && ncap <= Prog::kMaxOnePassCapture);

  // SearchBitState allocates a bit vector of size prog_->size() * text.size().
  // It also allocates a stack of 3-word structures which could potentially
  // grow as large as prog_->size() * text.size() but in practice is much
  // smaller.
  // Conditions for using SearchBitState:
  const int MaxBitStateProg = 500;   // prog_->size() <= Max.
  const int MaxBitStateVector = 256*1024;  // bit vector size <= Max (bits)
  bool can_bit_state = prog_->size() <= MaxBitStateProg;
  int bit_state_text_max = MaxBitStateVector / prog_->size();

  bool dfa_failed = false;
  switch (re_anchor) {
    default:
    case UNANCHORED: {
      if (!prog_->SearchDFA(subtext, text, anchor, kind,
                            matchp, &dfa_failed, NULL)) {
        if (dfa_failed) {
          // Fall back to NFA below.
          skipped_test = true;
          if (FLAGS_trace_re2)
            LOG(INFO) << "Match " << trunc(pattern_)
                      << " [" << CEscape(subtext) << "]"
                      << " DFA failed.";
          break;
        }
        if (FLAGS_trace_re2)
          LOG(INFO) << "Match " << trunc(pattern_)
                    << " [" << CEscape(subtext) << "]"
                    << " used DFA - no match.";
        return false;
      }
      if (FLAGS_trace_re2)
        LOG(INFO) << "Match " << trunc(pattern_)
                  << " [" << CEscape(subtext) << "]"
                  << " used DFA - match";
      if (matchp == NULL)  // Matched.  Don't care where
        return true;
      // SearchDFA set match[0].end() but didn't know where the
      // match started.  Run the regexp backward from match[0].end()
      // to find the longest possible match -- that's where it started.
      Prog* prog = ReverseProg();
      if (prog == NULL)
        return false;
      if (!prog->SearchDFA(match, text, Prog::kAnchored,
                           Prog::kLongestMatch, &match, &dfa_failed, NULL)) {
        if (dfa_failed) {
          // Fall back to NFA below.
          skipped_test = true;
          if (FLAGS_trace_re2)
            LOG(INFO) << "Match " << trunc(pattern_)
                      << " [" << CEscape(subtext) << "]"
                      << " reverse DFA failed.";
          break;
        }
        if (FLAGS_trace_re2)
          LOG(INFO) << "Match " << trunc(pattern_)
                    << " [" << CEscape(subtext) << "]"
                    << " DFA inconsistency.";
        if (options_.log_errors())
          LOG(ERROR) << "DFA inconsistency";
        return false;
      }
      if (FLAGS_trace_re2)
        LOG(INFO) << "Match " << trunc(pattern_)
                  << " [" << CEscape(subtext) << "]"
                  << " used reverse DFA.";
      break;
    }

    case ANCHOR_BOTH:
    case ANCHOR_START:
      if (re_anchor == ANCHOR_BOTH)
        kind = Prog::kFullMatch;
      anchor = Prog::kAnchored;

      // If only a small amount of text and need submatch
      // information anyway and we're going to use OnePass or BitState
      // to get it, we might as well not even bother with the DFA:
      // OnePass or BitState will be fast enough.
      // On tiny texts, OnePass outruns even the DFA, and
      // it doesn't have the shared state and occasional mutex that
      // the DFA does.
      if (can_one_pass && text.size() <= 4096 &&
          (ncap > 1 || text.size() <= 8)) {
        if (FLAGS_trace_re2)
          LOG(INFO) << "Match " << trunc(pattern_)
                    << " [" << CEscape(subtext) << "]"
                    << " skipping DFA for OnePass.";
        skipped_test = true;
        break;
      }
      if (can_bit_state && text.size() <= bit_state_text_max && ncap > 1) {
        if (FLAGS_trace_re2)
          LOG(INFO) << "Match " << trunc(pattern_)
                    << " [" << CEscape(subtext) << "]"
                    << " skipping DFA for BitState.";
        skipped_test = true;
        break;
      }
      if (!prog_->SearchDFA(subtext, text, anchor, kind,
                            &match, &dfa_failed, NULL)) {
        if (dfa_failed) {
          if (FLAGS_trace_re2)
            LOG(INFO) << "Match " << trunc(pattern_)
                      << " [" << CEscape(subtext) << "]"
                      << " DFA failed.";
          skipped_test = true;
          break;
        }
        if (FLAGS_trace_re2)
          LOG(INFO) << "Match " << trunc(pattern_)
                    << " [" << CEscape(subtext) << "]"
                    << " used DFA - no match.";
        return false;
      }
      break;
  }

  if (!skipped_test && ncap <= 1) {
    // We know exactly where it matches.  That's enough.
    if (ncap == 1)
      submatch[0] = match;
  } else {
    StringPiece subtext1;
    if (skipped_test) {
      // DFA ran out of memory or was skipped:
      // need to search in entire original text.
      subtext1 = subtext;
    } else {
      // DFA found the exact match location:
      // let NFA run an anchored, full match search
      // to find submatch locations.
      subtext1 = match;
      anchor = Prog::kAnchored;
      kind = Prog::kFullMatch;
    }

    if (can_one_pass && anchor != Prog::kUnanchored) {
      if (FLAGS_trace_re2)
        LOG(INFO) << "Match " << trunc(pattern_)
                  << " [" << CEscape(subtext) << "]"
                  << " using OnePass.";
      if (!prog_->SearchOnePass(subtext1, text, anchor, kind, submatch, ncap)) {
        if (!skipped_test && options_.log_errors())
          LOG(ERROR) << "SearchOnePass inconsistency";
        return false;
      }
    } else if (can_bit_state && subtext1.size() <= bit_state_text_max) {
      if (FLAGS_trace_re2)
        LOG(INFO) << "Match " << trunc(pattern_)
                  << " [" << CEscape(subtext) << "]"
                  << " using BitState.";
      if (!prog_->SearchBitState(subtext1, text, anchor,
                                 kind, submatch, ncap)) {
        if (!skipped_test && options_.log_errors())
          LOG(ERROR) << "SearchBitState inconsistency";
        return false;
      }
    } else {
      if (FLAGS_trace_re2)
        LOG(INFO) << "Match " << trunc(pattern_)
                  << " [" << CEscape(subtext) << "]"
                  << " using NFA.";
      if (!prog_->SearchNFA(subtext1, text, anchor, kind, submatch, ncap)) {
        if (!skipped_test && options_.log_errors())
          LOG(ERROR) << "SearchNFA inconsistency";
        return false;
      }
    }
  }

  // Adjust overall match for required prefix that we stripped off.
  if (prefixlen > 0 && nsubmatch > 0)
    submatch[0] = StringPiece(submatch[0].begin() - prefixlen,
                              submatch[0].size() + prefixlen);

  // Zero submatches that don't exist in the regexp.
  for (int i = ncap; i < nsubmatch; i++)
    submatch[i] = NULL;
  return true;
}